

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bxdfs.h
# Opt level: O3

SampledSpectrum __thiscall
pbrt::LayeredBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::ConductorBxDF>::f
          (LayeredBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::ConductorBxDF> *this,Vector3f wo,
          Vector3f wi,TransportMode mode)

{
  long lVar1;
  long lVar2;
  undefined8 uVar3;
  bool bVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  int i;
  uint uVar37;
  uint uVar38;
  uint uVar39;
  int iVar40;
  long lVar41;
  ulong uVar42;
  byte bVar43;
  LayeredBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::ConductorBxDF> *pLVar44;
  uint uVar45;
  uint64_t oldstate;
  ulong uVar46;
  ulong uVar47;
  long in_FS_OFFSET;
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  float fVar50;
  float fVar51;
  Float FVar52;
  float fVar53;
  float fVar82;
  ulong in_XMM0_Qb;
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  float fVar81;
  undefined1 auVar70 [16];
  undefined1 auVar83 [56];
  undefined1 auVar72 [64];
  undefined1 auVar73 [64];
  undefined1 auVar74 [64];
  float fVar84;
  uint in_XMM1_Db;
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  uint in_XMM1_Dd;
  undefined1 auVar107 [56];
  undefined1 auVar98 [64];
  undefined1 auVar90 [16];
  undefined1 auVar106 [60];
  undefined1 auVar99 [64];
  ulong in_XMM2_Qb;
  undefined1 auVar108 [16];
  float fVar109;
  undefined1 auVar110 [16];
  uint uVar112;
  undefined1 auVar111 [16];
  undefined1 in_ZMM7 [64];
  undefined4 in_XMM8_Da;
  undefined1 in_register_00001404 [12];
  Vector3f wo_00;
  Vector3f wo_01;
  Vector3f wo_02;
  Vector3f wo_03;
  Vector3f wo_04;
  Vector3f wo_05;
  Vector3f VVar113;
  Vector3f wo_06;
  Vector3f wo_07;
  Vector3f wo_08;
  Vector3f wo_09;
  Vector3f wo_10;
  Vector3f wo_11;
  Vector3f wo_12;
  Vector3f wo_13;
  Vector3f wo_14;
  Vector3f wo_15;
  Vector3f wo_16;
  Vector3f wo_17;
  SampledSpectrum SVar114;
  Vector3f wi_00;
  Vector3f wi_01;
  Vector3f wi_02;
  Vector3f wi_03;
  Vector3f wi_04;
  Vector3f wi_05;
  Vector3f wi_06;
  Vector3f wi_07;
  Vector3f wi_08;
  Vector3f wi_09;
  Vector3f wi_10;
  SampledSpectrum beta;
  SampledSpectrum fExit;
  BSDFSample wis;
  SampledSpectrum fExit_1;
  BSDFSample wos;
  undefined1 local_228 [16];
  undefined1 local_218 [16];
  LayeredBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::ConductorBxDF> *local_208;
  Float local_1fc;
  undefined1 local_1f8 [16];
  undefined1 local_1e8 [4];
  float afStack_1e4 [3];
  undefined1 local_1d8 [8];
  float fStack_1d0;
  float fStack_1cc;
  undefined1 local_1c8 [16];
  ushort local_1aa;
  undefined1 local_1a8 [16];
  ulong local_198;
  ulong uStack_190;
  float local_188;
  float fStack_184;
  float fStack_180;
  float fStack_17c;
  ConductorBxDF *local_178;
  ConductorBxDF *local_170;
  LayeredBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::ConductorBxDF> *local_168;
  float local_15c;
  float local_158;
  uint local_154;
  Tuple2<pbrt::Point2,_float> local_150;
  BSDFSample local_148;
  BSDFSample local_118;
  undefined1 local_e8 [4];
  float afStack_e4 [3];
  Tuple2<pbrt::Point2,_float> local_d8;
  float local_d0;
  TransportMode local_cc;
  ulong local_c8;
  ulong uStack_c0;
  undefined1 local_b8 [16];
  undefined1 local_a8 [16];
  float local_98;
  uint uStack_94;
  undefined4 uStack_90;
  uint uStack_8c;
  LayeredBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::ConductorBxDF> *local_80;
  BSDFSample local_78;
  undefined1 local_48 [8];
  float fStack_40;
  float fStack_3c;
  undefined1 auVar71 [64];
  undefined1 auVar75 [64];
  undefined1 auVar76 [64];
  undefined1 auVar77 [64];
  undefined1 auVar78 [64];
  undefined1 auVar79 [64];
  undefined1 auVar80 [64];
  undefined1 extraout_var [60];
  undefined1 auVar96 [64];
  undefined1 auVar97 [64];
  undefined1 auVar100 [64];
  undefined1 auVar101 [64];
  undefined1 auVar102 [64];
  undefined1 auVar103 [64];
  undefined1 auVar104 [64];
  undefined1 auVar105 [64];
  
  uStack_90 = 0;
  auVar72._4_60_ = wi._12_60_;
  auVar72._0_4_ = wi.super_Tuple3<pbrt::Vector3,_float>.z;
  local_1a8 = auVar72._0_16_;
  local_198 = wi.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  local_98 = wo.super_Tuple3<pbrt::Vector3,_float>.z;
  local_c8 = wo.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  uStack_190 = in_XMM2_Qb;
  uStack_c0 = in_XMM0_Qb;
  if (((this->config).twoSided != '\0') && (local_98 < 0.0)) {
    local_98 = -local_98;
    in_XMM1_Db = in_XMM1_Db ^ 0x80000000;
    uStack_90 = 0x80000000;
    in_XMM1_Dd = in_XMM1_Dd ^ 0x80000000;
    local_1a8._0_8_ = CONCAT44(wi._12_4_,auVar72._0_4_) ^ 0x8000000080000000;
    local_1a8._8_4_ = wi._16_4_ ^ 0x80000000;
    local_1a8._12_4_ = wi._20_4_ ^ 0x80000000;
    local_c8 = local_c8 ^ 0x8000000080000000;
    uStack_c0 = in_XMM0_Qb ^ 0x8000000080000000;
    local_198 = local_198 ^ 0x8000000080000000;
    uStack_190 = in_XMM2_Qb ^ 0x8000000080000000;
  }
  VVar113.super_Tuple3<pbrt::Vector3,_float>.z = local_1a8._0_4_;
  local_178 = &this->bottom;
  local_170 = local_178;
  uStack_94 = in_XMM1_Db;
  uStack_8c = in_XMM1_Dd;
  if (local_98 <= 0.0) {
    if (VVar113.super_Tuple3<pbrt::Vector3,_float>.z * local_98 <= 0.0) {
      local_1fc = this->thickness;
      local_170 = (ConductorBxDF *)0x0;
      pLVar44 = (LayeredBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::ConductorBxDF> *)0x0;
      local_208 = this;
      goto LAB_004802ab;
    }
    bVar43 = (this->config).nSamples;
    wo_01.super_Tuple3<pbrt::Vector3,_float>.z = local_98;
    wo_01.super_Tuple3<pbrt::Vector3,_float>.x = (float)(undefined4)local_c8;
    wo_01.super_Tuple3<pbrt::Vector3,_float>.y = (float)local_c8._4_4_;
    auVar107 = ZEXT856(CONCAT44(in_XMM1_Dd,uStack_90));
    auVar83 = ZEXT856(uStack_c0);
    wi_00.super_Tuple3<pbrt::Vector3,_float>.z = VVar113.super_Tuple3<pbrt::Vector3,_float>.z;
    wi_00.super_Tuple3<pbrt::Vector3,_float>.x = (float)(undefined4)local_198;
    wi_00.super_Tuple3<pbrt::Vector3,_float>.y = (float)local_198._4_4_;
    SVar114 = ConductorBxDF::f(&this->bottom,wo_01,wi_00,mode);
    auVar97._0_8_ = SVar114.values.values._8_8_;
    auVar97._8_56_ = auVar107;
    auVar61 = auVar97._0_16_;
    auVar98._0_8_ = SVar114.values.values._0_8_;
    auVar98._8_56_ = auVar83;
    auVar54 = auVar98._0_16_;
    pLVar44 = (LayeredBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::ConductorBxDF> *)0x0;
    local_178 = (ConductorBxDF *)0x0;
    local_1fc = 0.0;
    local_168 = this;
  }
  else {
    pLVar44 = this;
    if (VVar113.super_Tuple3<pbrt::Vector3,_float>.z * local_98 <= 0.0) {
      local_1fc = 0.0;
      local_208 = (LayeredBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::ConductorBxDF> *)0x0;
      local_178 = (ConductorBxDF *)0x0;
LAB_004802ab:
      local_188 = 0.0;
      fStack_184 = 0.0;
      fStack_180 = 0.0;
      fStack_17c = 0.0;
      local_168 = pLVar44;
      goto LAB_004802b5;
    }
    local_1fc = this->thickness;
    bVar43 = (this->config).nSamples;
    wo_00.super_Tuple3<pbrt::Vector3,_float>.z = local_98;
    wo_00.super_Tuple3<pbrt::Vector3,_float>.x = (float)(undefined4)local_c8;
    wo_00.super_Tuple3<pbrt::Vector3,_float>.y = (float)local_c8._4_4_;
    auVar107 = ZEXT856(CONCAT44(in_XMM1_Dd,uStack_90));
    auVar83 = ZEXT856(uStack_c0);
    VVar113.super_Tuple3<pbrt::Vector3,_float>.x = (float)(undefined4)local_198;
    VVar113.super_Tuple3<pbrt::Vector3,_float>.y = (float)local_198._4_4_;
    SVar114 = DielectricInterfaceBxDF::f(&this->top,wo_00,VVar113,mode);
    auVar96._0_8_ = SVar114.values.values._8_8_;
    auVar96._8_56_ = auVar107;
    auVar61 = auVar96._0_16_;
    auVar71._0_8_ = SVar114.values.values._0_8_;
    auVar71._8_56_ = auVar83;
    auVar54 = auVar71._0_16_;
    local_168 = (LayeredBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::ConductorBxDF> *)0x0;
    local_170 = (ConductorBxDF *)0x0;
  }
  fStack_17c = (float)bVar43;
  auVar54 = vmovlhps_avx(auVar54,auVar61);
  local_188 = auVar54._0_4_ * fStack_17c;
  fStack_184 = auVar54._4_4_ * fStack_17c;
  fStack_180 = auVar54._8_4_ * fStack_17c;
  fStack_17c = auVar54._12_4_ * fStack_17c;
  local_208 = pLVar44;
LAB_004802b5:
  if ((this->config).nSamples == '\0') {
    fVar50 = 0.0;
  }
  else {
    auVar54._4_4_ = uStack_94;
    auVar54._0_4_ = local_98;
    auVar54._8_4_ = uStack_90;
    auVar54._12_4_ = uStack_8c;
    wo_09.super_Tuple3<pbrt::Vector3,_float>._0_8_ = local_c8 * -0x395b586ca42e166b;
    wo_09.super_Tuple3<pbrt::Vector3,_float>._0_8_ =
         (CONCAT44((int)(wo_09.super_Tuple3<pbrt::Vector3,_float>._0_8_ >> 0x20),local_98) ^
         ((wo_09.super_Tuple3<pbrt::Vector3,_float>._0_8_ >> 0x2f ^
          wo_09.super_Tuple3<pbrt::Vector3,_float>._0_8_) * -0x395b586ca42e166b ^ 0x4fb7dae84dd6f2fc
         ) * -0x395b586ca42e166b) * -0x395b586ca42e166b;
    wo_09.super_Tuple3<pbrt::Vector3,_float>._0_8_ =
         (wo_09.super_Tuple3<pbrt::Vector3,_float>._0_8_ >> 0x2f ^
         wo_09.super_Tuple3<pbrt::Vector3,_float>._0_8_) * -0x395b586ca42e166b;
    wo_09.super_Tuple3<pbrt::Vector3,_float>._0_8_ =
         (*(uint *)(Options + 4) & 0xffffff ^ wo_09.super_Tuple3<pbrt::Vector3,_float>._0_8_ ^
          0x1a929e4d6f47a654 ^
         (wo_09.super_Tuple3<pbrt::Vector3,_float>._0_8_ >> 0x2f |
         (ulong)(*(uint *)(Options + 4) & 0xff000000))) * -0x395b586ca42e166b;
    wo_09.super_Tuple3<pbrt::Vector3,_float>._0_8_ =
         (wo_09.super_Tuple3<pbrt::Vector3,_float>._0_8_ >> 0x2f ^
         wo_09.super_Tuple3<pbrt::Vector3,_float>._0_8_) * -0x395b586ca42e166b;
    lVar1 = (wo_09.super_Tuple3<pbrt::Vector3,_float>._0_8_ >> 0x2f ^
            wo_09.super_Tuple3<pbrt::Vector3,_float>._0_8_) * 2 + 1;
    uVar3 = vcmpss_avx512f((undefined1  [16])0x0,auVar54,1);
    local_1aa = (ushort)uVar3 & 1;
    wo_09.super_Tuple3<pbrt::Vector3,_float>._0_8_ =
         (CONCAT44(0x4fb7dae8,local_1a8._0_4_) ^
         ((local_198 * -0x395b586ca42e166b >> 0x2f ^ local_198 * -0x395b586ca42e166b) *
          -0x395b586ca42e166b ^ 0x4fb7dae84dd6f2fc) * -0x395b586ca42e166b) * -0x395b586ca42e166b;
    wo_09.super_Tuple3<pbrt::Vector3,_float>._0_8_ =
         (wo_09.super_Tuple3<pbrt::Vector3,_float>._0_8_ >> 0x2f ^
         wo_09.super_Tuple3<pbrt::Vector3,_float>._0_8_) * -0x395b586ca42e166b;
    uVar45 = 0;
    local_cc = (TransportMode)(mode == Radiance);
    wo_09.super_Tuple3<pbrt::Vector3,_float>._0_8_ =
         (wo_09.super_Tuple3<pbrt::Vector3,_float>._0_8_ >> 0x2f ^
         wo_09.super_Tuple3<pbrt::Vector3,_float>._0_8_) * 0x5851f42d4c957f2d +
         lVar1 * 0x5851f42d4c957f2e;
    local_80 = pLVar44;
    do {
      uVar46 = wo_09.super_Tuple3<pbrt::Vector3,_float>._0_8_ * 0x5851f42d4c957f2d + lVar1;
      uVar47 = uVar46 * 0x5851f42d4c957f2d + lVar1;
      auVar48._8_8_ = 0;
      auVar48._0_8_ = uVar46;
      auVar49._8_8_ = 0;
      auVar49._0_8_ = uVar47;
      auVar54 = vpunpcklqdq_avx(auVar48,auVar49);
      auVar61 = vpsrlvq_avx2(auVar54,_DAT_00507020);
      auVar111 = vpsrlvq_avx2(auVar54,_DAT_00507030);
      auVar54 = vpsrlq_avx(auVar54,0x3b);
      auVar54 = vpshufd_avx(auVar54,0xe8);
      uVar47 = uVar47 * 0x5851f42d4c957f2d + lVar1;
      auVar61 = vpshufd_avx(auVar61 ^ auVar111,0xe8);
      auVar54 = vprorvd_avx512vl(auVar61,auVar54);
      auVar54 = vcvtudq2ps_avx512vl(auVar54);
      auVar61._8_4_ = 0x2f800000;
      auVar61._0_8_ = 0x2f8000002f800000;
      auVar61._12_4_ = 0x2f800000;
      auVar54 = vmulps_avx512vl(auVar54,auVar61);
      auVar111._8_4_ = 0x3f7fffff;
      auVar111._0_8_ = 0x3f7fffff3f7fffff;
      auVar111._12_4_ = 0x3f7fffff;
      auVar54 = vminps_avx512vl(auVar54,auVar111);
      local_d8 = (Tuple2<pbrt::Point2,_float>)vmovlps_avx(auVar54);
      uVar46 = uVar47;
      if (pLVar44 != (LayeredBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::ConductorBxDF> *)0x0) {
        uVar37 = (uint)(wo_09.super_Tuple3<pbrt::Vector3,_float>._0_8_ >> 0x2d) ^
                 (uint)(wo_09.super_Tuple3<pbrt::Vector3,_float>._0_8_ >> 0x1b);
        bVar43 = (byte)(wo_09.super_Tuple3<pbrt::Vector3,_float>._0_8_ >> 0x3b);
        auVar30._4_12_ = in_register_00001404;
        auVar30._0_4_ = in_XMM8_Da;
        auVar54 = vcvtusi2ss_avx512f(auVar30,uVar37 >> bVar43 | uVar37 << 0x20 - bVar43);
        auVar54 = vminss_avx(ZEXT416((uint)(auVar54._0_4_ * 2.3283064e-10)),ZEXT416(0x3f7fffff));
        wo_02.super_Tuple3<pbrt::Vector3,_float>.z = local_98;
        wo_02.super_Tuple3<pbrt::Vector3,_float>.x = (float)(undefined4)local_c8;
        wo_02.super_Tuple3<pbrt::Vector3,_float>.y = (float)local_c8._4_4_;
        DielectricInterfaceBxDF::Sample_f
                  (&local_78,&pLVar44->top,wo_02,auVar54._0_4_,(Point2f *)&local_d8,mode,
                   Transmission);
        if ((0.0 < local_78.pdf) &&
           ((local_78.wi.super_Tuple3<pbrt::Vector3,_float>.z != 0.0 ||
            (NAN(local_78.wi.super_Tuple3<pbrt::Vector3,_float>.z))))) {
          wo_09.super_Tuple3<pbrt::Vector3,_float>._0_8_ = uVar47 * 0x5851f42d4c957f2d + lVar1;
          uVar46 = wo_09.super_Tuple3<pbrt::Vector3,_float>._0_8_ * 0x5851f42d4c957f2d + lVar1;
          auVar55._8_8_ = 0;
          auVar55._0_8_ = wo_09.super_Tuple3<pbrt::Vector3,_float>._0_8_;
          auVar85._8_8_ = 0;
          auVar85._0_8_ = uVar46;
          auVar54 = vpunpcklqdq_avx(auVar55,auVar85);
          auVar61 = vpsrlvq_avx2(auVar54,_DAT_00507020);
          auVar111 = vpsrlvq_avx2(auVar54,_DAT_00507030);
          auVar54 = vpsrlq_avx(auVar54,0x3b);
          auVar54 = vpshufd_avx(auVar54,0xe8);
          uVar46 = uVar46 * 0x5851f42d4c957f2d + lVar1;
          auVar61 = vpshufd_avx(auVar61 ^ auVar111,0xe8);
          auVar54 = vprorvd_avx512vl(auVar61,auVar54);
          auVar54 = vcvtudq2ps_avx512vl(auVar54);
          auVar5._8_4_ = 0x2f800000;
          auVar5._0_8_ = 0x2f8000002f800000;
          auVar5._12_4_ = 0x2f800000;
          auVar54 = vmulps_avx512vl(auVar54,auVar5);
          auVar6._8_4_ = 0x3f7fffff;
          auVar6._0_8_ = 0x3f7fffff3f7fffff;
          auVar6._12_4_ = 0x3f7fffff;
          auVar54 = vminps_avx512vl(auVar54,auVar6);
          local_d8 = (Tuple2<pbrt::Point2,_float>)vmovlps_avx(auVar54);
          pLVar44 = local_80;
          if (local_208 != (LayeredBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::ConductorBxDF> *)0x0) {
            uVar37 = (uint)(uVar47 >> 0x2d) ^ (uint)(uVar47 >> 0x1b);
            bVar43 = (byte)(uVar47 >> 0x3b);
            auVar54 = vcvtusi2ss_avx512f(in_ZMM7._0_16_,uVar37 >> bVar43 | uVar37 << 0x20 - bVar43);
            auVar54 = vminss_avx(ZEXT416((uint)(auVar54._0_4_ * 2.3283064e-10)),ZEXT416(0x3f7fffff))
            ;
            wo_03.super_Tuple3<pbrt::Vector3,_float>.z = (float)local_1a8._0_4_;
            wo_03.super_Tuple3<pbrt::Vector3,_float>.x = (float)(undefined4)local_198;
            wo_03.super_Tuple3<pbrt::Vector3,_float>.y = (float)local_198._4_4_;
            DielectricInterfaceBxDF::Sample_f
                      (&local_118,&local_208->top,wo_03,auVar54._0_4_,(Point2f *)&local_d8,local_cc,
                       Transmission);
            pLVar44 = local_80;
            if (0.0 < local_118.pdf) {
              if ((local_118.wi.super_Tuple3<pbrt::Vector3,_float>.z != 0.0) ||
                 (NAN(local_118.wi.super_Tuple3<pbrt::Vector3,_float>.z))) {
                local_228._4_4_ = local_78.wi.super_Tuple3<pbrt::Vector3,_float>.z;
                local_228._0_4_ = local_78.wi.super_Tuple3<pbrt::Vector3,_float>.z;
                local_228._8_4_ = local_78.wi.super_Tuple3<pbrt::Vector3,_float>.z;
                local_228._12_4_ = local_78.wi.super_Tuple3<pbrt::Vector3,_float>.z;
                auVar7._8_4_ = 0x7fffffff;
                auVar7._0_8_ = 0x7fffffff7fffffff;
                auVar7._12_4_ = 0x7fffffff;
                auVar54 = vandps_avx512vl(local_228,auVar7);
                auVar86._0_4_ = auVar54._0_4_ * local_78.f.values.values[0];
                auVar86._4_4_ = auVar54._4_4_ * local_78.f.values.values[1];
                auVar86._8_4_ = auVar54._8_4_ * local_78.f.values.values[2];
                auVar86._12_4_ = auVar54._12_4_ * local_78.f.values.values[3];
                auVar8._4_4_ = local_78.pdf;
                auVar8._0_4_ = local_78.pdf;
                auVar8._8_4_ = local_78.pdf;
                auVar8._12_4_ = local_78.pdf;
                _local_1e8 = vdivps_avx512vl(auVar86,auVar8);
                if ((this->config).maxDepth != '\0') {
                  auVar56._4_4_ = local_118.pdf;
                  auVar56._0_4_ = local_118.pdf;
                  auVar56._8_4_ = local_118.pdf;
                  auVar56._12_4_ = local_118.pdf;
                  uVar37 = 0;
                  _local_48 = vdivps_avx((undefined1  [16])local_118.f.values.values,auVar56);
                  local_1f8 = ZEXT416((uint)((byte)local_1aa & 1) * (int)this->thickness);
                  local_d0 = this->g;
                  local_218._8_8_ = 0;
                  local_218._0_4_ = local_78.wi.super_Tuple3<pbrt::Vector3,_float>.x;
                  local_218._4_4_ = local_78.wi.super_Tuple3<pbrt::Vector3,_float>.y;
                  auVar54 = vfmadd213ss_fma(ZEXT416((uint)local_d0),ZEXT416((uint)local_d0),
                                            SUB6416(ZEXT464(0x3f800000),0));
                  local_154 = auVar54._0_4_;
                  local_158 = local_d0 + local_d0;
                  auVar54 = vfnmadd213ss_fma(ZEXT416((uint)local_d0),ZEXT416((uint)local_d0),
                                             SUB6416(ZEXT464(0x3f800000),0));
                  local_15c = auVar54._0_4_ * 0.07957747;
                  do {
                    fVar50 = 1.0;
                    if (3 < uVar37) {
                      auVar72 = ZEXT464((uint)local_1e8);
                      lVar41 = 1;
                      auVar98 = ZEXT464((uint)local_1e8);
                      do {
                        lVar2 = lVar41 * 4;
                        lVar41 = lVar41 + 1;
                        auVar54 = vmaxss_avx(ZEXT416(*(uint *)(local_1e8 + lVar2)),auVar98._0_16_);
                        auVar98 = ZEXT1664(auVar54);
                      } while (lVar41 != 4);
                      if (auVar54._0_4_ < 0.25) {
                        lVar41 = 1;
                        do {
                          lVar2 = lVar41 * 4;
                          lVar41 = lVar41 + 1;
                          auVar54 = vmaxss_avx(ZEXT416(*(uint *)(local_1e8 + lVar2)),auVar72._0_16_)
                          ;
                          auVar72 = ZEXT1664(auVar54);
                        } while (lVar41 != 4);
                        uVar38 = (uint)(uVar46 >> 0x2d) ^ (uint)(uVar46 >> 0x1b);
                        bVar43 = (byte)(uVar46 >> 0x3b);
                        auVar54 = vmaxss_avx(ZEXT416((uint)(1.0 - auVar54._0_4_)),ZEXT816(0) << 0x40
                                            );
                        uVar46 = uVar46 * 0x5851f42d4c957f2d + lVar1;
                        auVar31._4_12_ = in_register_00001404;
                        auVar31._0_4_ = in_XMM8_Da;
                        auVar61 = vcvtusi2ss_avx512f(auVar31,uVar38 >> bVar43 |
                                                             uVar38 << 0x20 - bVar43);
                        auVar61 = vminss_avx(ZEXT416((uint)(auVar61._0_4_ * 2.3283064e-10)),
                                             ZEXT416(0x3f7fffff));
                        pLVar44 = local_80;
                        if (auVar61._0_4_ < auVar54._0_4_) break;
                        fVar84 = 1.0 - auVar54._0_4_;
                        auVar57._4_4_ = fVar84;
                        auVar57._0_4_ = fVar84;
                        auVar57._8_4_ = fVar84;
                        auVar57._12_4_ = fVar84;
                        _local_1e8 = vdivps_avx(_local_1e8,auVar57);
                      }
                    }
                    fVar84 = (this->albedo).values.values[0];
                    uVar38 = local_218._8_4_;
                    uVar112 = local_218._12_4_;
                    wo_09.super_Tuple3<pbrt::Vector3,_float>._0_8_ = local_218._0_8_;
                    fVar53 = local_228._0_4_;
                    if ((fVar84 != 0.0) || (NAN(fVar84))) {
LAB_00480816:
                      uVar39 = (uint)(uVar46 >> 0x2d) ^ (uint)(uVar46 >> 0x1b);
                      bVar43 = (byte)(uVar46 >> 0x3b);
                      auVar32._4_12_ = in_register_00001404;
                      auVar32._0_4_ = in_XMM8_Da;
                      auVar54 = vcvtusi2ss_avx512f(auVar32,uVar39 >> bVar43 |
                                                           uVar39 << 0x20 - bVar43);
                      auVar54 = vminss_avx(ZEXT416((uint)(auVar54._0_4_ * 2.3283064e-10)),
                                           ZEXT416(0x3f7fffff));
                      auVar73._0_4_ = logf(1.0 - auVar54._0_4_);
                      auVar73._4_60_ = extraout_var;
                      local_1c8 = auVar73._0_16_;
                      if ((LayeredBxDF<pbrt::DielectricInterfaceBxDF,pbrt::ConductorBxDF>::
                           f(pbrt::Vector3<float>,pbrt::Vector3<float>,pbrt::TransportMode)::reg ==
                           '\0') &&
                         (iVar40 = __cxa_guard_acquire(&
                                                  LayeredBxDF<pbrt::DielectricInterfaceBxDF,pbrt::ConductorBxDF>
                                                  ::
                                                  f(pbrt::Vector3<float>,pbrt::Vector3<float>,pbrt::TransportMode)
                                                  ::reg), iVar40 != 0)) {
                        StatRegisterer::StatRegisterer
                                  ((StatRegisterer *)
                                   &LayeredBxDF<pbrt::DielectricInterfaceBxDF,pbrt::ConductorBxDF>::
                                    f(pbrt::Vector3<float>,pbrt::Vector3<float>,pbrt::TransportMode)
                                    ::reg,const::{lambda(pbrt::StatsAccumulator&)#1}::
                                          StatsAccumulator__,(PixelAccumFunc)0x0);
                        __cxa_guard_release(&LayeredBxDF<pbrt::DielectricInterfaceBxDF,pbrt::ConductorBxDF>
                                             ::
                                             f(pbrt::Vector3<float>,pbrt::Vector3<float>,pbrt::TransportMode)
                                             ::reg);
                      }
                      *(long *)(in_FS_OFFSET + -0x70) = *(long *)(in_FS_OFFSET + -0x70) + 1;
                      auVar9._8_4_ = 0x7fffffff;
                      auVar9._0_8_ = 0x7fffffff7fffffff;
                      auVar9._12_4_ = 0x7fffffff;
                      auVar54 = vandps_avx512vl(local_228,auVar9);
                      uVar46 = uVar46 * 0x5851f42d4c957f2d + lVar1;
                      fVar50 = -(float)local_1c8._0_4_ / (1.0 / auVar54._0_4_);
                      auVar35._12_4_ = 0;
                      auVar35._0_12_ = ZEXT812(0);
                      uVar3 = vcmpss_avx512f(auVar35 << 0x20,local_228,1);
                      bVar4 = (bool)((byte)uVar3 & 1);
                      fVar50 = (float)local_1f8._0_4_ +
                               (float)((uint)bVar4 * (int)fVar50 + (uint)!bVar4 * (int)-fVar50);
                      auVar54 = local_1f8;
                      auVar62 = local_218;
                      if (((float)local_1f8._0_4_ != fVar50) ||
                         (NAN((float)local_1f8._0_4_) || NAN(fVar50))) {
                        if ((fVar50 <= 0.0) || (this->thickness <= fVar50)) {
                          uVar3 = vcmpss_avx512f(ZEXT416((uint)fVar50),ZEXT816(0) << 0x20,1);
                          auVar54 = vminss_avx(ZEXT416((uint)this->thickness),ZEXT416((uint)fVar50))
                          ;
                          local_1c8._4_12_ = auVar54._4_12_;
                          local_1c8._0_4_ = (uint)!(bool)((byte)uVar3 & 1) * auVar54._0_4_;
                          goto LAB_004809ea;
                        }
                        auVar61 = vmovshdup_avx(local_218);
                        if (local_208 ==
                            (LayeredBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::ConductorBxDF> *)0x0)
                        {
                          auVar111 = vminss_avx(ZEXT416((uint)(local_170->mfDistrib).alpha_y),
                                                ZEXT416((uint)(local_170->mfDistrib).alpha_x));
                          fVar84 = auVar111._0_4_;
                        }
                        else {
                          auVar111 = vminss_avx(ZEXT416((uint)(local_208->top).mfDistrib.alpha_y),
                                                ZEXT416((uint)(local_208->top).mfDistrib.alpha_x));
                          fVar84 = auVar111._0_4_;
                        }
                        auVar111 = SUB6416(ZEXT464(0x3f800000),0);
                        if (0.001 <= fVar84) {
                          auVar111 = vfmadd231ss_fma(ZEXT416((uint)(auVar61._0_4_ *
                                                                   local_118.wi.
                                                                                                                                      
                                                  super_Tuple3<pbrt::Vector3,_float>.y)),local_218,
                                                  ZEXT416((uint)local_118.wi.
                                                                super_Tuple3<pbrt::Vector3,_float>.x
                                                         ));
                          auVar111 = vfmadd231ss_fma(auVar111,local_228,
                                                     ZEXT416((uint)local_118.wi.
                                                                                                                                      
                                                  super_Tuple3<pbrt::Vector3,_float>.z));
                          auVar48 = vfmadd213ss_fma(auVar111,ZEXT416((uint)local_158),
                                                    ZEXT416(local_154));
                          auVar111 = vmaxss_avx(auVar48,auVar35 << 0x20);
                          auVar111 = vsqrtss_avx(auVar111,auVar111);
                          fVar84 = local_15c / (auVar48._0_4_ * auVar111._0_4_);
                          auVar111 = vfmadd231ss_fma(ZEXT416((uint)(fVar84 * fVar84)),
                                                     ZEXT416((uint)local_118.pdf),
                                                     ZEXT416((uint)local_118.pdf));
                          auVar111 = ZEXT416((uint)((local_118.pdf * local_118.pdf) / auVar111._0_4_
                                                   ));
                        }
                        local_1c8 = ZEXT416((uint)fVar50);
                        auVar10._8_4_ = 0x7fffffff;
                        auVar10._0_8_ = 0x7fffffff7fffffff;
                        auVar10._12_4_ = 0x7fffffff;
                        local_a8 = vandps_avx512vl(ZEXT416((uint)(fVar50 - local_1fc)),auVar10);
                        fVar50 = 1.0;
                        if (1.1754944e-38 < local_a8._0_4_) {
                          auVar11._8_4_ = 0x80000000;
                          auVar11._0_8_ = 0x8000000080000000;
                          auVar11._12_4_ = 0x80000000;
                          auVar48 = vxorps_avx512vl(local_a8,auVar11);
                          auVar12._8_4_ = 0x7fffffff;
                          auVar12._0_8_ = 0x7fffffff7fffffff;
                          auVar12._12_4_ = 0x7fffffff;
                          auVar49 = vandps_avx512vl(ZEXT416((uint)local_118.wi.
                                                                  super_Tuple3<pbrt::Vector3,_float>
                                                                  .z),auVar12);
                          _local_1d8 = auVar61;
                          local_b8 = auVar111;
                          fVar50 = expf(auVar48._0_4_ / auVar49._0_4_);
                          auVar61 = _local_1d8;
                          auVar111 = local_b8;
                        }
                        in_ZMM7 = ZEXT1664(auVar111);
                        auVar108._0_8_ =
                             wo_09.super_Tuple3<pbrt::Vector3,_float>._0_8_ ^ 0x8000000080000000;
                        auVar108._8_4_ = uVar38 ^ 0x80000000;
                        auVar108._12_4_ = uVar112 ^ 0x80000000;
                        auVar61 = vfmadd132ss_fma(local_218,
                                                  ZEXT416((uint)(auVar61._0_4_ *
                                                                local_118.wi.
                                                                super_Tuple3<pbrt::Vector3,_float>.y
                                                                )),
                                                  ZEXT416((uint)local_118.wi.
                                                                super_Tuple3<pbrt::Vector3,_float>.x
                                                         ));
                        uVar3 = vmovlps_avx(auVar108);
                        auVar61 = vfmadd231ss_fma(auVar61,local_228,
                                                  ZEXT416((uint)local_118.wi.
                                                                super_Tuple3<pbrt::Vector3,_float>.z
                                                         ));
                        auVar48 = vfmadd213ss_fma(auVar61,ZEXT416((uint)local_158),
                                                  ZEXT416(local_154));
                        auVar61 = vmaxss_avx(auVar48,ZEXT816(0));
                        auVar61 = vsqrtss_avx(auVar61,auVar61);
                        fVar84 = local_15c / (auVar48._0_4_ * auVar61._0_4_);
                        fVar81 = auVar111._0_4_;
                        local_148.f.values.values[2] = -fVar53;
                        local_148.f.values.values[0] = (float)(int)uVar3;
                        local_148.f.values.values[1] = (float)(int)((ulong)uVar3 >> 0x20);
                        local_188 = fVar50 * fVar81 * fVar84 * (this->albedo).values.values[0] *
                                                               (float)local_1e8 *
                                    (float)local_48._0_4_ + local_188;
                        fStack_184 = fVar50 * fVar81 * fVar84 * (this->albedo).values.values[1] *
                                                                afStack_1e4[0] *
                                     (float)local_48._4_4_ + fStack_184;
                        fStack_180 = fVar50 * fVar81 * fVar84 * (this->albedo).values.values[2] *
                                                                afStack_1e4[1] * fStack_40 +
                                     fStack_180;
                        fStack_17c = fVar50 * fVar81 * fVar84 * (this->albedo).values.values[3] *
                                                                afStack_1e4[2] * fStack_3c +
                                     fStack_17c;
                        wo_09.super_Tuple3<pbrt::Vector3,_float>._0_8_ =
                             uVar46 * 0x5851f42d4c957f2d + lVar1;
                        auVar60._8_8_ = 0;
                        auVar60._0_8_ = uVar46;
                        auVar90._8_8_ = 0;
                        auVar90._0_8_ = wo_09.super_Tuple3<pbrt::Vector3,_float>._0_8_;
                        auVar61 = vpunpcklqdq_avx(auVar60,auVar90);
                        auVar111 = vpsrlvq_avx2(auVar61,_DAT_00507020);
                        auVar48 = vpsrlvq_avx2(auVar61,_DAT_00507030);
                        auVar61 = vpsrlq_avx(auVar61,0x3b);
                        auVar61 = vpshufd_avx(auVar61,0xe8);
                        uVar46 = wo_09.super_Tuple3<pbrt::Vector3,_float>._0_8_ * 0x5851f42d4c957f2d
                                 + lVar1;
                        auVar111 = vpshufd_avx(auVar111 ^ auVar48,0xe8);
                        auVar106 = ZEXT1260(auVar111._4_12_);
                        auVar61 = vprorvd_avx512vl(auVar111,auVar61);
                        auVar61 = vcvtudq2ps_avx512vl(auVar61);
                        auVar13._8_4_ = 0x2f800000;
                        auVar13._0_8_ = 0x2f8000002f800000;
                        auVar13._12_4_ = 0x2f800000;
                        auVar61 = vmulps_avx512vl(auVar61,auVar13);
                        auVar14._8_4_ = 0x3f7fffff;
                        auVar14._0_8_ = 0x3f7fffff3f7fffff;
                        auVar14._12_4_ = 0x3f7fffff;
                        auVar61 = vminps_avx512vl(auVar61,auVar14);
                        _local_e8 = vmovlps_avx(auVar61);
                        auVar83 = (undefined1  [56])0x0;
                        VVar113 = SampleHenyeyGreenstein
                                            ((Vector3f *)&local_148,local_d0,(Point2f *)local_e8,
                                             &local_150.x);
                        auVar99._0_4_ = VVar113.super_Tuple3<pbrt::Vector3,_float>.z;
                        auVar99._4_60_ = auVar106;
                        auVar74._0_8_ = VVar113.super_Tuple3<pbrt::Vector3,_float>._0_8_;
                        auVar74._8_56_ = auVar83;
                        fVar50 = local_150.x;
                        auVar61 = auVar99._0_16_;
                        if ((0.0 < local_150.x) && ((auVar99._0_4_ != 0.0 || (NAN(auVar99._0_4_)))))
                        {
                          auVar62 = auVar74._0_16_;
                          auVar63._4_4_ = local_150.x;
                          auVar63._0_4_ = local_150.x;
                          auVar63._8_4_ = local_150.x;
                          auVar63._12_4_ = local_150.x;
                          auVar91._0_4_ = local_150.x * (this->albedo).values.values[0];
                          auVar91._4_4_ = local_150.x * (this->albedo).values.values[1];
                          auVar91._8_4_ = local_150.x * (this->albedo).values.values[2];
                          auVar91._12_4_ = local_150.x * (this->albedo).values.values[3];
                          auVar54 = vdivps_avx(auVar91,auVar63);
                          afStack_1e4[0] = auVar54._4_4_ * afStack_1e4[0];
                          local_1e8 = (undefined1  [4])(auVar54._0_4_ * (float)local_1e8);
                          afStack_1e4[1] = auVar54._8_4_ * afStack_1e4[1];
                          afStack_1e4[2] = auVar54._12_4_ * afStack_1e4[2];
                          auVar111 = ZEXT416((uint)local_150.x);
                          local_228 = auVar61;
                          if (local_208 ==
                              (LayeredBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::ConductorBxDF> *)0x0
                             ) {
                            auVar48 = vminss_avx(ZEXT416((uint)(local_170->mfDistrib).alpha_y),
                                                 ZEXT416((uint)(local_170->mfDistrib).alpha_x));
                            auVar54 = local_1c8;
                            if (0.001 <= auVar48._0_4_) {
                              auVar69._0_8_ = auVar74._0_8_ ^ 0x8000000080000000;
                              auVar69._8_4_ = auVar83._0_4_ ^ 0x80000000;
                              auVar69._12_4_ = auVar83._4_4_ ^ 0x80000000;
                              wo_16.super_Tuple3<pbrt::Vector3,_float>.z = -auVar99._0_4_;
                              local_b8._0_8_ =
                                   CONCAT44(auVar106._0_4_,auVar99._0_4_) ^ 0x8000000080000000;
                              local_b8._8_4_ = auVar106._4_4_ ^ 0x80000000;
                              local_b8._12_4_ = auVar106._8_4_ ^ 0x80000000;
                              wo_16.super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)auVar69._0_8_
                              ;
                              wo_16.super_Tuple3<pbrt::Vector3,_float>.y =
                                   (float)(int)(auVar69._0_8_ >> 0x20);
                              auVar107 = ZEXT856(local_b8._8_8_);
                              auVar83 = ZEXT856(auVar69._8_8_);
                              wi_09.super_Tuple3<pbrt::Vector3,_float>.z = (float)local_1a8._0_4_;
                              wi_09.super_Tuple3<pbrt::Vector3,_float>.x =
                                   (float)(undefined4)local_198;
                              wi_09.super_Tuple3<pbrt::Vector3,_float>.y = (float)local_198._4_4_;
                              _local_1d8 = auVar61;
                              SVar114 = ConductorBxDF::f(local_170,wo_16,wi_09,mode);
                              auVar105._0_8_ = SVar114.values.values._8_8_;
                              auVar105._8_56_ = auVar107;
                              auVar61 = auVar105._0_16_;
                              auVar80._0_8_ = SVar114.values.values._0_8_;
                              auVar80._8_56_ = auVar83;
                              auVar54 = auVar80._0_16_;
                              goto LAB_00481561;
                            }
                          }
                          else {
                            auVar48 = vminss_avx(ZEXT416((uint)(local_208->top).mfDistrib.alpha_y),
                                                 ZEXT416((uint)(local_208->top).mfDistrib.alpha_x));
                            auVar54 = local_1c8;
                            if (0.001 <= auVar48._0_4_) {
                              auVar64._0_8_ = auVar74._0_8_ ^ 0x8000000080000000;
                              auVar64._8_4_ = auVar83._0_4_ ^ 0x80000000;
                              auVar64._12_4_ = auVar83._4_4_ ^ 0x80000000;
                              wo_06.super_Tuple3<pbrt::Vector3,_float>.z = -auVar99._0_4_;
                              local_b8._0_8_ =
                                   CONCAT44(auVar106._0_4_,auVar99._0_4_) ^ 0x8000000080000000;
                              local_b8._8_4_ = auVar106._4_4_ ^ 0x80000000;
                              local_b8._12_4_ = auVar106._8_4_ ^ 0x80000000;
                              wo_06.super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)auVar64._0_8_
                              ;
                              wo_06.super_Tuple3<pbrt::Vector3,_float>.y =
                                   (float)(int)(auVar64._0_8_ >> 0x20);
                              auVar107 = ZEXT856(local_b8._8_8_);
                              auVar83 = ZEXT856(auVar64._8_8_);
                              wi_01.super_Tuple3<pbrt::Vector3,_float>.z = (float)local_1a8._0_4_;
                              wi_01.super_Tuple3<pbrt::Vector3,_float>.x =
                                   (float)(undefined4)local_198;
                              wi_01.super_Tuple3<pbrt::Vector3,_float>.y = (float)local_198._4_4_;
                              _local_1d8 = auVar61;
                              SVar114 = DielectricInterfaceBxDF::f(&local_208->top,wo_06,wi_01,mode)
                              ;
                              auVar100._0_8_ = SVar114.values.values._8_8_;
                              auVar100._8_56_ = auVar107;
                              auVar61 = auVar100._0_16_;
                              auVar75._0_8_ = SVar114.values.values._0_8_;
                              auVar75._8_56_ = auVar83;
                              auVar54 = auVar75._0_16_;
LAB_00481561:
                              local_1f8._0_8_ = auVar74._0_8_ ^ 0x8000000080000000;
                              local_148.f.values.values =
                                   (array<float,_4>)vmovlhps_avx(auVar54,auVar61);
                              if ((auVar54._0_4_ == 0.0) && (!NAN(auVar54._0_4_))) {
                                wo_09.super_Tuple3<pbrt::Vector3,_float>._0_8_ = 0xffffffffffffffff;
                                do {
                                  auVar54 = local_1c8;
                                  local_228 = _local_1d8;
                                  if (wo_09.super_Tuple3<pbrt::Vector3,_float>._0_8_ == 2)
                                  goto LAB_00480f5a;
                                  fVar84 = local_148.f.values.values
                                           [wo_09.super_Tuple3<pbrt::Vector3,_float>._0_8_ + 2];
                                  wo_09.super_Tuple3<pbrt::Vector3,_float>._0_8_ =
                                       wo_09.super_Tuple3<pbrt::Vector3,_float>._0_8_ + 1;
                                } while ((fVar84 == 0.0) && (!NAN(fVar84)));
                                auVar54 = local_1c8;
                                local_228 = _local_1d8;
                                if (2 < wo_09.super_Tuple3<pbrt::Vector3,_float>._0_8_)
                                goto LAB_00480f5a;
                              }
                              if (local_208 ==
                                  (LayeredBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::ConductorBxDF> *
                                  )0x0) {
                                FVar52 = 0.0;
                              }
                              else {
                                wo_17.super_Tuple3<pbrt::Vector3,_float>.z = (float)local_b8._0_4_;
                                wo_17.super_Tuple3<pbrt::Vector3,_float>.x = (float)local_1f8._0_4_;
                                wo_17.super_Tuple3<pbrt::Vector3,_float>.y = (float)local_1f8._4_4_;
                                wi_10.super_Tuple3<pbrt::Vector3,_float>.z = (float)local_1a8._0_4_;
                                wi_10.super_Tuple3<pbrt::Vector3,_float>.x =
                                     (float)(undefined4)local_198;
                                wi_10.super_Tuple3<pbrt::Vector3,_float>.y = (float)local_198._4_4_;
                                FVar52 = DielectricInterfaceBxDF::PDF
                                                   (&local_208->top,wo_17,wi_10,mode,Transmission);
                              }
                              fVar84 = 1.0;
                              if (1.1754944e-38 < local_a8._0_4_) {
                                auVar15._8_4_ = 0x80000000;
                                auVar15._0_8_ = 0x8000000080000000;
                                auVar15._12_4_ = 0x80000000;
                                auVar54 = vxorps_avx512vl(local_a8,auVar15);
                                auVar16._8_4_ = 0x7fffffff;
                                auVar16._0_8_ = 0x7fffffff7fffffff;
                                auVar16._12_4_ = 0x7fffffff;
                                auVar61 = vandps_avx512vl(_local_1d8,auVar16);
                                fVar84 = expf(auVar54._0_4_ / auVar61._0_4_);
                              }
                              fVar53 = fVar84 * (float)local_1e8 * local_148.f.values.values[0];
                              fVar81 = fVar84 * afStack_1e4[0] * local_148.f.values.values[1];
                              fVar82 = fVar84 * afStack_1e4[1] * local_148.f.values.values[2];
                              fVar84 = fVar84 * afStack_1e4[2] * local_148.f.values.values[3];
                              auVar54 = vfmadd231ss_fma(ZEXT416((uint)(FVar52 * FVar52)),auVar111,
                                                        auVar111);
                              fVar50 = (fVar50 * fVar50) / auVar54._0_4_;
                              goto LAB_0048176a;
                            }
                          }
                        }
                      }
                      else {
                        *(long *)(in_FS_OFFSET + -0x78) = *(long *)(in_FS_OFFSET + -0x78) + 1;
                      }
                    }
                    else {
                      uVar47 = 0;
                      do {
                        uVar42 = uVar47;
                        if (uVar42 == 3) goto LAB_0048091d;
                        fVar84 = (this->albedo).values.values[uVar42 + 1];
                      } while ((fVar84 == 0.0) && (uVar47 = uVar42 + 1, !NAN(fVar84)));
                      if (uVar42 < 3) goto LAB_00480816;
LAB_0048091d:
                      FVar52 = this->thickness;
                      local_1c8 = ZEXT416((uint)FVar52);
                      auVar27._8_4_ = 0x7fffffff;
                      auVar27._0_8_ = 0x7fffffff7fffffff;
                      auVar27._12_4_ = 0x7fffffff;
                      auVar54 = vandps_avx512vl(ZEXT416((uint)FVar52),auVar27);
                      if (1.1754944e-38 < auVar54._0_4_) {
                        auVar28._8_4_ = 0x80000000;
                        auVar28._0_8_ = 0x8000000080000000;
                        auVar28._12_4_ = 0x80000000;
                        auVar54 = vxorps_avx512vl(auVar54,auVar28);
                        auVar29._8_4_ = 0x7fffffff;
                        auVar29._0_8_ = 0x7fffffff7fffffff;
                        auVar29._12_4_ = 0x7fffffff;
                        auVar61 = vandps_avx512vl(local_228,auVar29);
                        local_1c8 = ZEXT416((uint)FVar52);
                        fVar50 = expf(auVar54._0_4_ / auVar61._0_4_);
                      }
                      uVar3 = vcmpss_avx512f(local_1c8,ZEXT416((uint)local_1f8._0_4_),0);
                      local_1c8._0_4_ = (uint)!(bool)((byte)uVar3 & 1) * local_1c8._0_4_;
                      afStack_1e4[0] = fVar50 * afStack_1e4[0];
                      local_1e8 = (undefined1  [4])(fVar50 * (float)local_1e8);
                      afStack_1e4[1] = fVar50 * afStack_1e4[1];
                      afStack_1e4[2] = fVar50 * afStack_1e4[2];
LAB_004809ea:
                      FVar52 = local_118.pdf;
                      bVar43 = (byte)(uVar46 >> 0x38);
                      uVar39 = (uint)(uVar46 >> 0x20);
                      if ((local_1c8._0_4_ != local_1fc) || (NAN(local_1c8._0_4_) || NAN(local_1fc))
                         ) {
                        if (local_168 ==
                            (LayeredBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::ConductorBxDF> *)0x0)
                        {
                          auVar54 = vminss_avx(ZEXT416((uint)(local_178->mfDistrib).alpha_y),
                                               ZEXT416((uint)(local_178->mfDistrib).alpha_x));
                          fVar50 = auVar54._0_4_;
                        }
                        else {
                          auVar54 = vminss_avx(ZEXT416((uint)(local_168->top).mfDistrib.alpha_y),
                                               ZEXT416((uint)(local_168->top).mfDistrib.alpha_x));
                          fVar50 = auVar54._0_4_;
                        }
                        if (0.001 <= fVar50) {
                          if (local_208 ==
                              (LayeredBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::ConductorBxDF> *)0x0
                             ) {
                            auVar54 = vminss_avx(ZEXT416((uint)(local_170->mfDistrib).alpha_y),
                                                 ZEXT416((uint)(local_170->mfDistrib).alpha_x));
                            fVar50 = auVar54._0_4_;
                          }
                          else {
                            auVar54 = vminss_avx(ZEXT416((uint)(local_208->top).mfDistrib.alpha_y),
                                                 ZEXT416((uint)(local_208->top).mfDistrib.alpha_x));
                            fVar50 = auVar54._0_4_;
                          }
                          if (0.001 <= fVar50) {
                            wo_07.super_Tuple3<pbrt::Vector3,_float>.z = -fVar53;
                            auVar65._0_8_ =
                                 wo_09.super_Tuple3<pbrt::Vector3,_float>._0_8_ ^ 0x8000000080000000
                            ;
                            auVar65._8_4_ = uVar38 ^ 0x80000000;
                            auVar65._12_4_ = uVar112 ^ 0x80000000;
                            wi_02.super_Tuple3<pbrt::Vector3,_float>._0_8_ =
                                 CONCAT44(local_118.wi.super_Tuple3<pbrt::Vector3,_float>.y,
                                          local_118.wi.super_Tuple3<pbrt::Vector3,_float>.x) ^
                                 0x8000000080000000;
                            wi_02.super_Tuple3<pbrt::Vector3,_float>.z =
                                 -local_118.wi.super_Tuple3<pbrt::Vector3,_float>.z;
                            local_228._0_8_ = local_228._0_8_ ^ 0x8000000080000000;
                            local_228._8_4_ = local_228._8_4_ ^ 0x80000000;
                            local_228._12_4_ = local_228._12_4_ ^ 0x80000000;
                            if (local_168 ==
                                (LayeredBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::ConductorBxDF> *)
                                0x0) {
                              wo_08.super_Tuple3<pbrt::Vector3,_float>.z =
                                   wo_07.super_Tuple3<pbrt::Vector3,_float>.z;
                              wo_08.super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)auVar65._0_8_
                              ;
                              wo_08.super_Tuple3<pbrt::Vector3,_float>.y =
                                   (float)(int)(auVar65._0_8_ >> 0x20);
                              wi_03.super_Tuple3<pbrt::Vector3,_float>.z =
                                   wi_02.super_Tuple3<pbrt::Vector3,_float>.z;
                              wi_03.super_Tuple3<pbrt::Vector3,_float>.x =
                                   (float)(int)wi_02.super_Tuple3<pbrt::Vector3,_float>._0_8_;
                              wi_03.super_Tuple3<pbrt::Vector3,_float>.y =
                                   (float)(int)(wi_02.super_Tuple3<pbrt::Vector3,_float>._0_8_ >>
                                               0x20);
                              fVar50 = ConductorBxDF::PDF(local_178,wo_08,wi_03,mode,All);
                            }
                            else {
                              wo_07.super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)auVar65._0_8_
                              ;
                              wo_07.super_Tuple3<pbrt::Vector3,_float>.y =
                                   (float)(int)(auVar65._0_8_ >> 0x20);
                              fVar50 = DielectricInterfaceBxDF::PDF
                                                 (&local_168->top,wo_07,wi_02,mode,All);
                            }
                            uVar47 = CONCAT44(local_118.wi.super_Tuple3<pbrt::Vector3,_float>.y,
                                              local_118.wi.super_Tuple3<pbrt::Vector3,_float>.x);
                            auVar54 = vfmadd231ss_fma(ZEXT416((uint)(fVar50 * fVar50)),
                                                      ZEXT416((uint)FVar52),ZEXT416((uint)FVar52));
                            fVar50 = (FVar52 * FVar52) / auVar54._0_4_;
                          }
                          else {
                            uVar47 = CONCAT44(local_118.wi.super_Tuple3<pbrt::Vector3,_float>.y,
                                              local_118.wi.super_Tuple3<pbrt::Vector3,_float>.x);
                            fVar50 = 1.0;
                            auVar65._0_8_ =
                                 wo_09.super_Tuple3<pbrt::Vector3,_float>._0_8_ ^ 0x8000000080000000
                            ;
                            auVar65._8_4_ = uVar38 ^ 0x80000000;
                            auVar65._12_4_ = uVar112 ^ 0x80000000;
                            local_228._0_8_ = local_228._0_8_ ^ 0x8000000080000000;
                            local_228._8_4_ = local_228._8_4_ ^ 0x80000000;
                            local_228._12_4_ = local_228._12_4_ ^ 0x80000000;
                          }
                          wi_04.super_Tuple3<pbrt::Vector3,_float>._0_8_ =
                               uVar47 ^ 0x8000000080000000;
                          wi_04.super_Tuple3<pbrt::Vector3,_float>.z =
                               -local_118.wi.super_Tuple3<pbrt::Vector3,_float>.z;
                          wo_09.super_Tuple3<pbrt::Vector3,_float>._0_8_ = auVar65._0_8_;
                          wo_09.super_Tuple3<pbrt::Vector3,_float>.z = local_228._0_4_;
                          auVar83 = ZEXT856(local_228._8_8_);
                          if (local_168 ==
                              (LayeredBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::ConductorBxDF> *)0x0
                             ) {
                            wo_10.super_Tuple3<pbrt::Vector3,_float>.z =
                                 wo_09.super_Tuple3<pbrt::Vector3,_float>.z;
                            wo_10.super_Tuple3<pbrt::Vector3,_float>.x =
                                 (float)(int)wo_09.super_Tuple3<pbrt::Vector3,_float>._0_8_;
                            wo_10.super_Tuple3<pbrt::Vector3,_float>.y =
                                 (float)(int)(wo_09.super_Tuple3<pbrt::Vector3,_float>._0_8_ >> 0x20
                                             );
                            auVar107 = ZEXT856(auVar65._8_8_);
                            wi_05.super_Tuple3<pbrt::Vector3,_float>.z =
                                 wi_04.super_Tuple3<pbrt::Vector3,_float>.z;
                            wi_05.super_Tuple3<pbrt::Vector3,_float>.x =
                                 (float)(int)wi_04.super_Tuple3<pbrt::Vector3,_float>._0_8_;
                            wi_05.super_Tuple3<pbrt::Vector3,_float>.y =
                                 (float)(int)(wi_04.super_Tuple3<pbrt::Vector3,_float>._0_8_ >> 0x20
                                             );
                            SVar114 = ConductorBxDF::f(local_178,wo_10,wi_05,mode);
                            auVar102._0_8_ = SVar114.values.values._8_8_;
                            auVar102._8_56_ = auVar83;
                            auVar61 = auVar102._0_16_;
                            auVar77._0_8_ = SVar114.values.values._0_8_;
                            auVar77._8_56_ = auVar107;
                            auVar54 = auVar77._0_16_;
                          }
                          else {
                            auVar107 = ZEXT856(auVar65._8_8_);
                            SVar114 = DielectricInterfaceBxDF::f(&local_168->top,wo_09,wi_04,mode);
                            auVar101._0_8_ = SVar114.values.values._8_8_;
                            auVar101._8_56_ = auVar83;
                            auVar61 = auVar101._0_16_;
                            auVar76._0_8_ = SVar114.values.values._0_8_;
                            auVar76._8_56_ = auVar107;
                            auVar54 = auVar76._0_16_;
                          }
                          auVar54 = vmovlhps_avx(auVar54,auVar61);
                          auVar92._8_4_ = 0x7fffffff;
                          auVar92._0_8_ = 0x7fffffff7fffffff;
                          auVar92._12_4_ = 0x7fffffff;
                          fVar84 = auVar54._0_4_ * (float)local_1e8;
                          fVar53 = auVar54._4_4_ * afStack_1e4[0];
                          fVar81 = auVar54._8_4_ * afStack_1e4[1];
                          fVar82 = auVar54._12_4_ * afStack_1e4[2];
                          auVar54 = vandps_avx(ZEXT416((uint)local_118.wi.
                                                             super_Tuple3<pbrt::Vector3,_float>.z),
                                               auVar92);
                          auVar61 = vandps_avx(ZEXT416((uint)this->thickness),auVar92);
                          fVar51 = 1.0;
                          if (1.1754944e-38 < auVar61._0_4_) {
                            auVar26._8_4_ = 0x80000000;
                            auVar26._0_8_ = 0x8000000080000000;
                            auVar26._12_4_ = 0x80000000;
                            auVar61 = vxorps_avx512vl(auVar61,auVar26);
                            local_1d8._4_4_ = fVar53;
                            local_1d8._0_4_ = fVar84;
                            fStack_1d0 = fVar81;
                            fStack_1cc = fVar82;
                            local_a8 = auVar54;
                            fVar51 = expf(auVar61._0_4_ / auVar54._0_4_);
                            auVar54 = local_a8;
                            fVar84 = (float)local_1d8._0_4_;
                            fVar53 = (float)local_1d8._4_4_;
                            fVar81 = fStack_1d0;
                            fVar82 = fStack_1cc;
                          }
                          fVar109 = auVar54._0_4_;
                          local_188 = fVar51 * fVar50 * fVar109 * fVar84 * (float)local_48._0_4_ +
                                      local_188;
                          fStack_184 = fVar51 * fVar50 * fVar109 * fVar53 * (float)local_48._4_4_ +
                                       fStack_184;
                          fStack_180 = fVar51 * fVar50 * fVar109 * fVar81 * fStack_40 + fStack_180;
                          fStack_17c = fVar51 * fVar50 * fVar109 * fVar82 * fStack_3c + fStack_17c;
                        }
                        else {
                          wo_09.super_Tuple3<pbrt::Vector3,_float>._0_8_ =
                               wo_09.super_Tuple3<pbrt::Vector3,_float>._0_8_ ^ 0x8000000080000000;
                          local_228._0_8_ = local_228._0_8_ ^ 0x8000000080000000;
                          local_228._8_4_ = local_228._8_4_ ^ 0x80000000;
                          local_228._12_4_ = local_228._12_4_ ^ 0x80000000;
                        }
                        uVar38 = uVar39 >> 0xd ^ (uint)(uVar46 >> 0x1b);
                        bVar43 = bVar43 >> 3;
                        auVar34._4_12_ = in_register_00001404;
                        auVar34._0_4_ = in_XMM8_Da;
                        auVar54 = vcvtusi2ss_avx512f(auVar34,uVar38 >> bVar43 |
                                                             uVar38 << 0x20 - bVar43);
                        uVar46 = uVar46 * 0x5851f42d4c957f2d + lVar1;
                        auVar54 = vminss_avx(ZEXT416((uint)(auVar54._0_4_ * 2.3283064e-10)),
                                             ZEXT416(0x3f7fffff));
                        uVar47 = uVar46 * 0x5851f42d4c957f2d + lVar1;
                        auVar93._8_8_ = 0;
                        auVar93._0_8_ = uVar47;
                        auVar110._8_8_ = 0;
                        auVar110._0_8_ = uVar46;
                        auVar61 = vpunpcklqdq_avx(auVar110,auVar93);
                        auVar111 = vpsrlvq_avx2(auVar61,_DAT_00507020);
                        auVar48 = vpsrlvq_avx2(auVar61,_DAT_00507030);
                        auVar49 = vpsrlq_avx(auVar61,0x3b);
                        auVar61 = vpshufd_avx(auVar111 ^ auVar48,0xe8);
                        auVar111 = vpshufd_avx(auVar49,0xe8);
                        auVar61 = vprorvd_avx512vl(auVar61,auVar111);
                        auVar61 = vcvtudq2ps_avx512vl(auVar61);
                        auVar20._8_4_ = 0x2f800000;
                        auVar20._0_8_ = 0x2f8000002f800000;
                        auVar20._12_4_ = 0x2f800000;
                        auVar61 = vmulps_avx512vl(auVar61,auVar20);
                        auVar21._8_4_ = 0x3f7fffff;
                        auVar21._0_8_ = 0x3f7fffff3f7fffff;
                        auVar21._12_4_ = 0x3f7fffff;
                        auVar61 = vminps_avx512vl(auVar61,auVar21);
                        local_150 = (Tuple2<pbrt::Point2,_float>)vmovlps_avx(auVar61);
                        wo_11.super_Tuple3<pbrt::Vector3,_float>.z = local_228._0_4_;
                        if (local_168 ==
                            (LayeredBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::ConductorBxDF> *)0x0)
                        {
                          wo_12.super_Tuple3<pbrt::Vector3,_float>.z =
                               wo_11.super_Tuple3<pbrt::Vector3,_float>.z;
                          wo_12.super_Tuple3<pbrt::Vector3,_float>.x =
                               (float)(int)wo_09.super_Tuple3<pbrt::Vector3,_float>._0_8_;
                          wo_12.super_Tuple3<pbrt::Vector3,_float>.y =
                               (float)(int)(wo_09.super_Tuple3<pbrt::Vector3,_float>._0_8_ >> 0x20);
                          ConductorBxDF::Sample_f
                                    (&local_148,local_178,wo_12,auVar54._0_4_,(Point2f *)&local_150,
                                     mode,Reflection);
                        }
                        else {
                          wo_11.super_Tuple3<pbrt::Vector3,_float>.x =
                               (float)(int)wo_09.super_Tuple3<pbrt::Vector3,_float>._0_8_;
                          wo_11.super_Tuple3<pbrt::Vector3,_float>.y =
                               (float)(int)(wo_09.super_Tuple3<pbrt::Vector3,_float>._0_8_ >> 0x20);
                          DielectricInterfaceBxDF::Sample_f
                                    (&local_148,&local_168->top,wo_11,auVar54._0_4_,
                                     (Point2f *)&local_150,mode,Reflection);
                        }
                        local_218._0_8_ = local_148.wi.super_Tuple3<pbrt::Vector3,_float>._0_8_;
                        uVar46 = uVar47 * 0x5851f42d4c957f2d + lVar1;
                        pLVar44 = local_80;
                        if (local_148.pdf <= 0.0) break;
                        if ((local_148.wi.super_Tuple3<pbrt::Vector3,_float>.z == 0.0) &&
                           (!NAN(local_148.wi.super_Tuple3<pbrt::Vector3,_float>.z))) break;
                        auVar94._4_4_ = local_148.wi.super_Tuple3<pbrt::Vector3,_float>.z;
                        auVar94._0_4_ = local_148.wi.super_Tuple3<pbrt::Vector3,_float>.z;
                        auVar94._8_4_ = local_148.wi.super_Tuple3<pbrt::Vector3,_float>.z;
                        auVar94._12_4_ = local_148.wi.super_Tuple3<pbrt::Vector3,_float>.z;
                        auVar22._8_4_ = 0x7fffffff;
                        auVar22._0_8_ = 0x7fffffff7fffffff;
                        auVar22._12_4_ = 0x7fffffff;
                        auVar54 = vandps_avx512vl(auVar94,auVar22);
                        auVar66._4_4_ = local_148.pdf;
                        auVar66._0_4_ = local_148.pdf;
                        auVar66._8_4_ = local_148.pdf;
                        auVar66._12_4_ = local_148.pdf;
                        auVar62._8_8_ = 0;
                        auVar62._0_4_ = local_148.wi.super_Tuple3<pbrt::Vector3,_float>.x;
                        auVar62._4_4_ = local_148.wi.super_Tuple3<pbrt::Vector3,_float>.y;
                        auVar95._0_4_ = auVar54._0_4_ * local_148.f.values.values[0];
                        auVar95._4_4_ = auVar54._4_4_ * local_148.f.values.values[1];
                        auVar95._8_4_ = auVar54._8_4_ * local_148.f.values.values[2];
                        auVar95._12_4_ = auVar54._12_4_ * local_148.f.values.values[3];
                        auVar54 = vdivps_avx(auVar95,auVar66);
                        afStack_1e4[0] = auVar54._4_4_ * afStack_1e4[0];
                        local_1e8 = (undefined1  [4])(auVar54._0_4_ * (float)local_1e8);
                        afStack_1e4[1] = auVar54._8_4_ * afStack_1e4[1];
                        afStack_1e4[2] = auVar54._12_4_ * afStack_1e4[2];
                        local_228 = ZEXT416((uint)local_148.wi.super_Tuple3<pbrt::Vector3,_float>.z)
                        ;
                        if (local_208 ==
                            (LayeredBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::ConductorBxDF> *)0x0)
                        {
                          auVar61 = vminss_avx(ZEXT416((uint)(local_170->mfDistrib).alpha_y),
                                               ZEXT416((uint)(local_170->mfDistrib).alpha_x));
                          auVar54 = local_1c8;
                          if (0.001 <= auVar61._0_4_) {
                            auVar68._0_8_ =
                                 local_148.wi.super_Tuple3<pbrt::Vector3,_float>._0_8_ ^
                                 0x8000000080000000;
                            auVar68._8_4_ = 0x80000000;
                            auVar68._12_4_ = 0x80000000;
                            local_1f8._0_4_ = -local_148.wi.super_Tuple3<pbrt::Vector3,_float>.z;
                            local_1f8._4_4_ = 0x80000000;
                            local_1f8._8_4_ = 0x80000000;
                            local_1f8._12_4_ = 0x80000000;
                            wo_14.super_Tuple3<pbrt::Vector3,_float>.z = (float)local_1f8._0_4_;
                            wo_14.super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)auVar68._0_8_;
                            wo_14.super_Tuple3<pbrt::Vector3,_float>.y =
                                 (float)(int)(auVar68._0_8_ >> 0x20);
                            auVar107 = ZEXT856(local_1f8._8_8_);
                            auVar83 = ZEXT856(auVar68._8_8_);
                            wi_07.super_Tuple3<pbrt::Vector3,_float>.z = (float)local_1a8._0_4_;
                            wi_07.super_Tuple3<pbrt::Vector3,_float>.x =
                                 (float)(undefined4)local_198;
                            wi_07.super_Tuple3<pbrt::Vector3,_float>.y = (float)local_198._4_4_;
                            _local_1d8 = ZEXT416((uint)local_148.wi.
                                                       super_Tuple3<pbrt::Vector3,_float>.z);
                            SVar114 = ConductorBxDF::f(local_170,wo_14,wi_07,mode);
                            auVar104._0_8_ = SVar114.values.values._8_8_;
                            auVar104._8_56_ = auVar107;
                            auVar61 = auVar104._0_16_;
                            auVar79._0_8_ = SVar114.values.values._0_8_;
                            auVar79._8_56_ = auVar83;
                            auVar54 = auVar79._0_16_;
                            goto LAB_0048140c;
                          }
                        }
                        else {
                          auVar61 = vminss_avx(ZEXT416((uint)(local_208->top).mfDistrib.alpha_y),
                                               ZEXT416((uint)(local_208->top).mfDistrib.alpha_x));
                          auVar54 = local_1c8;
                          if (0.001 <= auVar61._0_4_) {
                            auVar67._0_8_ =
                                 local_148.wi.super_Tuple3<pbrt::Vector3,_float>._0_8_ ^
                                 0x8000000080000000;
                            auVar67._8_4_ = 0x80000000;
                            auVar67._12_4_ = 0x80000000;
                            local_1f8._0_4_ = -local_148.wi.super_Tuple3<pbrt::Vector3,_float>.z;
                            local_1f8._4_4_ = 0x80000000;
                            local_1f8._8_4_ = 0x80000000;
                            local_1f8._12_4_ = 0x80000000;
                            wo_13.super_Tuple3<pbrt::Vector3,_float>.z = (float)local_1f8._0_4_;
                            wo_13.super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)auVar67._0_8_;
                            wo_13.super_Tuple3<pbrt::Vector3,_float>.y =
                                 (float)(int)(auVar67._0_8_ >> 0x20);
                            auVar107 = ZEXT856(local_1f8._8_8_);
                            auVar83 = ZEXT856(auVar67._8_8_);
                            wi_06.super_Tuple3<pbrt::Vector3,_float>.z = (float)local_1a8._0_4_;
                            wi_06.super_Tuple3<pbrt::Vector3,_float>.x =
                                 (float)(undefined4)local_198;
                            wi_06.super_Tuple3<pbrt::Vector3,_float>.y = (float)local_198._4_4_;
                            _local_1d8 = ZEXT416((uint)local_148.wi.
                                                       super_Tuple3<pbrt::Vector3,_float>.z);
                            SVar114 = DielectricInterfaceBxDF::f(&local_208->top,wo_13,wi_06,mode);
                            auVar103._0_8_ = SVar114.values.values._8_8_;
                            auVar103._8_56_ = auVar107;
                            auVar61 = auVar103._0_16_;
                            auVar78._0_8_ = SVar114.values.values._0_8_;
                            auVar78._8_56_ = auVar83;
                            auVar54 = auVar78._0_16_;
LAB_0048140c:
                            local_218._0_8_ = local_218._0_8_ ^ 0x8000000080000000;
                            _local_e8 = vmovlhps_avx(auVar54,auVar61);
                            if ((auVar54._0_4_ == 0.0) && (!NAN(auVar54._0_4_))) {
                              wo_09.super_Tuple3<pbrt::Vector3,_float>._0_8_ = 0xffffffffffffffff;
                              do {
                                auVar54 = local_1c8;
                                local_228 = _local_1d8;
                                if (wo_09.super_Tuple3<pbrt::Vector3,_float>._0_8_ == 2)
                                goto LAB_00480f5a;
                                lVar41 = wo_09.super_Tuple3<pbrt::Vector3,_float>._0_8_ * 4;
                                wo_09.super_Tuple3<pbrt::Vector3,_float>._0_8_ =
                                     wo_09.super_Tuple3<pbrt::Vector3,_float>._0_8_ + 1;
                              } while ((*(float *)(local_e8 + lVar41 + 8) == 0.0) &&
                                      (!NAN(*(float *)(local_e8 + lVar41 + 8))));
                              auVar54 = local_1c8;
                              local_228 = _local_1d8;
                              if (2 < wo_09.super_Tuple3<pbrt::Vector3,_float>._0_8_)
                              goto LAB_00480f5a;
                            }
                            if (local_168 ==
                                (LayeredBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::ConductorBxDF> *)
                                0x0) {
                              auVar54 = vminss_avx(ZEXT416((uint)(local_178->mfDistrib).alpha_y),
                                                   ZEXT416((uint)(local_178->mfDistrib).alpha_x));
                              fVar84 = auVar54._0_4_;
                            }
                            else {
                              auVar54 = vminss_avx(ZEXT416((uint)(local_168->top).mfDistrib.alpha_y)
                                                   ,ZEXT416((uint)(local_168->top).mfDistrib.alpha_x
                                                           ));
                              fVar84 = auVar54._0_4_;
                            }
                            fVar50 = 1.0;
                            if (0.001 <= fVar84) {
                              if (local_208 ==
                                  (LayeredBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::ConductorBxDF> *
                                  )0x0) {
                                fVar50 = 0.0;
                              }
                              else {
                                wo_15.super_Tuple3<pbrt::Vector3,_float>.z = (float)local_1f8._0_4_;
                                wo_15.super_Tuple3<pbrt::Vector3,_float>.x = (float)local_218._0_4_;
                                wo_15.super_Tuple3<pbrt::Vector3,_float>.y = (float)local_218._4_4_;
                                wi_08.super_Tuple3<pbrt::Vector3,_float>.z = (float)local_1a8._0_4_;
                                wi_08.super_Tuple3<pbrt::Vector3,_float>.x =
                                     (float)(undefined4)local_198;
                                wi_08.super_Tuple3<pbrt::Vector3,_float>.y = (float)local_198._4_4_;
                                fVar50 = DielectricInterfaceBxDF::PDF
                                                   (&local_208->top,wo_15,wi_08,mode,Transmission);
                              }
                              auVar54 = vfmadd231ss_fma(ZEXT416((uint)(fVar50 * fVar50)),
                                                        ZEXT416((uint)local_148.pdf),
                                                        ZEXT416((uint)local_148.pdf));
                              fVar50 = (local_148.pdf * local_148.pdf) / auVar54._0_4_;
                            }
                            fVar84 = 1.0;
                            auVar23._8_4_ = 0x7fffffff;
                            auVar23._0_8_ = 0x7fffffff7fffffff;
                            auVar23._12_4_ = 0x7fffffff;
                            auVar54 = vandps_avx512vl(ZEXT416((uint)this->thickness),auVar23);
                            if (1.1754944e-38 < auVar54._0_4_) {
                              auVar24._8_4_ = 0x80000000;
                              auVar24._0_8_ = 0x8000000080000000;
                              auVar24._12_4_ = 0x80000000;
                              auVar54 = vxorps_avx512vl(auVar54,auVar24);
                              auVar25._8_4_ = 0x7fffffff;
                              auVar25._0_8_ = 0x7fffffff7fffffff;
                              auVar25._12_4_ = 0x7fffffff;
                              auVar61 = vandps_avx512vl(ZEXT416((uint)local_148.wi.
                                                                                                                                            
                                                  super_Tuple3<pbrt::Vector3,_float>.z),auVar25);
                              fVar84 = expf(auVar54._0_4_ / auVar61._0_4_);
                            }
                            fVar53 = fVar84 * (float)local_1e8 * (float)local_e8;
                            fVar81 = fVar84 * afStack_1e4[0] * afStack_e4[0];
                            fVar82 = fVar84 * afStack_1e4[1] * afStack_e4[1];
                            fVar84 = fVar84 * afStack_1e4[2] * afStack_e4[2];
LAB_0048176a:
                            local_188 = fVar50 * fVar53 + local_188;
                            fStack_184 = fVar50 * fVar81 + fStack_184;
                            fStack_180 = fVar50 * fVar82 + fStack_180;
                            fStack_17c = fVar50 * fVar84 + fStack_17c;
                            auVar54 = local_1c8;
                            local_228 = _local_1d8;
                          }
                        }
                      }
                      else {
                        uVar38 = uVar39 >> 0xd ^ (uint)(uVar46 >> 0x1b);
                        bVar43 = bVar43 >> 3;
                        uVar46 = uVar46 * 0x5851f42d4c957f2d + lVar1;
                        auVar33._4_12_ = in_register_00001404;
                        auVar33._0_4_ = in_XMM8_Da;
                        auVar54 = vcvtusi2ss_avx512f(auVar33,uVar38 >> bVar43 |
                                                             uVar38 << 0x20 - bVar43);
                        uVar47 = uVar46 * 0x5851f42d4c957f2d + lVar1;
                        auVar54 = vminss_avx(ZEXT416((uint)(auVar54._0_4_ * 2.3283064e-10)),
                                             ZEXT416(0x3f7fffff));
                        auVar58._8_8_ = 0;
                        auVar58._0_8_ = uVar46;
                        auVar87._8_8_ = 0;
                        auVar87._0_8_ = uVar47;
                        auVar61 = vpunpcklqdq_avx(auVar58,auVar87);
                        auVar111 = vpsrlvq_avx2(auVar61,_DAT_00507020);
                        auVar48 = vpsrlvq_avx2(auVar61,_DAT_00507030);
                        auVar61 = vpsrlq_avx(auVar61,0x3b);
                        auVar61 = vpshufd_avx(auVar61,0xe8);
                        auVar111 = vpshufd_avx(auVar111 ^ auVar48,0xe8);
                        auVar61 = vprorvd_avx512vl(auVar111,auVar61);
                        auVar61 = vcvtudq2ps_avx512vl(auVar61);
                        auVar17._8_4_ = 0x2f800000;
                        auVar17._0_8_ = 0x2f8000002f800000;
                        auVar17._12_4_ = 0x2f800000;
                        auVar61 = vmulps_avx512vl(auVar61,auVar17);
                        auVar18._8_4_ = 0x3f7fffff;
                        auVar18._0_8_ = 0x3f7fffff3f7fffff;
                        auVar18._12_4_ = 0x3f7fffff;
                        auVar61 = vminps_avx512vl(auVar61,auVar18);
                        uVar3 = vmovlps_avx(auVar61);
                        _local_e8 = uVar3;
                        wo_04.super_Tuple3<pbrt::Vector3,_float>._0_8_ =
                             wo_09.super_Tuple3<pbrt::Vector3,_float>._0_8_ ^ 0x8000000080000000;
                        wo_04.super_Tuple3<pbrt::Vector3,_float>.z = -fVar53;
                        if (local_208 ==
                            (LayeredBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::ConductorBxDF> *)0x0)
                        {
                          wo_05.super_Tuple3<pbrt::Vector3,_float>.z =
                               wo_04.super_Tuple3<pbrt::Vector3,_float>.z;
                          wo_05.super_Tuple3<pbrt::Vector3,_float>.x =
                               (float)(int)wo_04.super_Tuple3<pbrt::Vector3,_float>._0_8_;
                          wo_05.super_Tuple3<pbrt::Vector3,_float>.y =
                               (float)(int)(wo_04.super_Tuple3<pbrt::Vector3,_float>._0_8_ >> 0x20);
                          ConductorBxDF::Sample_f
                                    (&local_148,local_170,wo_05,auVar54._0_4_,(Point2f *)local_e8,
                                     mode,Reflection);
                        }
                        else {
                          DielectricInterfaceBxDF::Sample_f
                                    (&local_148,&local_208->top,wo_04,auVar54._0_4_,
                                     (Point2f *)local_e8,mode,Reflection);
                        }
                        uVar46 = uVar47 * 0x5851f42d4c957f2d + lVar1;
                        pLVar44 = local_80;
                        if (local_148.pdf <= 0.0) break;
                        if ((local_148.wi.super_Tuple3<pbrt::Vector3,_float>.z == 0.0) &&
                           (!NAN(local_148.wi.super_Tuple3<pbrt::Vector3,_float>.z))) break;
                        auVar88._4_4_ = local_148.wi.super_Tuple3<pbrt::Vector3,_float>.z;
                        auVar88._0_4_ = local_148.wi.super_Tuple3<pbrt::Vector3,_float>.z;
                        auVar88._8_4_ = local_148.wi.super_Tuple3<pbrt::Vector3,_float>.z;
                        auVar88._12_4_ = local_148.wi.super_Tuple3<pbrt::Vector3,_float>.z;
                        auVar19._8_4_ = 0x7fffffff;
                        auVar19._0_8_ = 0x7fffffff7fffffff;
                        auVar19._12_4_ = 0x7fffffff;
                        auVar54 = vandps_avx512vl(auVar88,auVar19);
                        auVar59._4_4_ = local_148.pdf;
                        auVar59._0_4_ = local_148.pdf;
                        auVar59._8_4_ = local_148.pdf;
                        auVar59._12_4_ = local_148.pdf;
                        auVar62._8_8_ = 0;
                        auVar62._0_4_ = local_148.wi.super_Tuple3<pbrt::Vector3,_float>.x;
                        auVar62._4_4_ = local_148.wi.super_Tuple3<pbrt::Vector3,_float>.y;
                        auVar89._0_4_ = auVar54._0_4_ * local_148.f.values.values[0];
                        auVar89._4_4_ = auVar54._4_4_ * local_148.f.values.values[1];
                        auVar89._8_4_ = auVar54._8_4_ * local_148.f.values.values[2];
                        auVar89._12_4_ = auVar54._12_4_ * local_148.f.values.values[3];
                        auVar54 = vdivps_avx(auVar89,auVar59);
                        afStack_1e4[0] = auVar54._4_4_ * afStack_1e4[0];
                        local_1e8 = (undefined1  [4])(auVar54._0_4_ * (float)local_1e8);
                        afStack_1e4[1] = auVar54._8_4_ * afStack_1e4[1];
                        afStack_1e4[2] = auVar54._12_4_ * afStack_1e4[2];
                        auVar54 = local_1c8;
                        local_228 = ZEXT416((uint)local_148.wi.super_Tuple3<pbrt::Vector3,_float>.z)
                        ;
                      }
                    }
LAB_00480f5a:
                    local_218 = auVar62;
                    local_1f8 = auVar54;
                    uVar37 = uVar37 + 1;
                    pLVar44 = local_80;
                  } while (uVar37 < (this->config).maxDepth);
                }
              }
            }
          }
        }
      }
      bVar43 = (this->config).nSamples;
      uVar45 = uVar45 + 1;
      wo_09.super_Tuple3<pbrt::Vector3,_float>._0_8_ = uVar46;
    } while (uVar45 < bVar43);
    fVar50 = (float)bVar43;
  }
  auVar36._4_4_ = fStack_184;
  auVar36._0_4_ = local_188;
  auVar36._8_4_ = fStack_180;
  auVar36._12_4_ = fStack_17c;
  auVar70._4_4_ = fVar50;
  auVar70._0_4_ = fVar50;
  auVar70._8_4_ = fVar50;
  auVar70._12_4_ = fVar50;
  auVar54 = vdivps_avx(auVar36,auVar70);
  auVar61 = vshufpd_avx(auVar54,auVar54,1);
  SVar114.values.values._0_8_ = auVar54._0_8_;
  SVar114.values.values._8_8_ = auVar61._0_8_;
  return (SampledSpectrum)SVar114.values.values;
}

Assistant:

f(Vector3f wo, Vector3f wi, TransportMode mode) const {
        SampledSpectrum f(0.);
        // Set _wi_ and _wi_ for layered BSDF evaluation
        if (config.twoSided && wo.z < 0) {
            // BIG WIN
            wo = -wo;
            wi = -wi;
        }

        // Determine entrance and exit interfaces for layered BSDF
        bool enteredTop = wo.z > 0;
        TopOrBottomBxDF<TopBxDF, BottomBxDF> enterInterface, exitInterface;
        TopOrBottomBxDF<TopBxDF, BottomBxDF> nonExitInterface;
        if (enteredTop)
            enterInterface = &top;
        else
            enterInterface = &bottom;
        if (SameHemisphere(wo, wi) ^ enteredTop) {
            exitInterface = &bottom;
            nonExitInterface = &top;
        } else {
            exitInterface = &top;
            nonExitInterface = &bottom;
        }
        Float exitZ = (SameHemisphere(wo, wi) ^ enteredTop) ? 0 : thickness;

        // Account for reflection at the entrance interface
        if (SameHemisphere(wo, wi))
            f = config.nSamples * enterInterface.f(wo, wi, mode);

        // Declare _RNG_ for layered BSDF evaluation
        RNG rng(Hash(GetOptions().seed, wo), Hash(wi));
        auto r = [&rng]() {
            return std::min<Float>(rng.Uniform<Float>(), OneMinusEpsilon);
        };

        for (int s = 0; s < config.nSamples; ++s) {
            // Sample random walk through layers to estimate BSDF value
            // Sample transmission direction through entrance interface
            Float uc = r();
            Point2f u(r(), r());
            BSDFSample wos = enterInterface.Sample_f(wo, uc, u, mode,
                                                     BxDFReflTransFlags::Transmission);
            if (!wos || wos.wi.z == 0)
                continue;

            // Sample BSDF for NEE in _wi_'s direction
            uc = r();
            u = Point2f(r(), r());
            BSDFSample wis = exitInterface.Sample_f(wi, uc, u, ~mode,
                                                    BxDFReflTransFlags::Transmission);
            if (!wis || wis.wi.z == 0)
                continue;

            // Declare state for random walk through BSDF layers
            SampledSpectrum beta = wos.f * AbsCosTheta(wos.wi) / wos.pdf;
            SampledSpectrum betaExit = wis.f / wis.pdf;
            Vector3f w = wos.wi;
            Float z = enteredTop ? thickness : 0;
            HGPhaseFunction phase(g);

            for (int depth = 0; depth < config.maxDepth; ++depth) {
                // Sample next event for layered BSDF evaluation random walk
                PBRT_DBG("beta: %f %f %f %f, w: %f %f %f, f: %f %f %f %f\n", beta[0],
                         beta[1], beta[2], beta[3], w.x, w.y, w.z, f[0], f[1], f[2],
                         f[3]);
                // Possibly terminate layered BSDF random walk with Russian Roulette
                if (depth > 3 && beta.MaxComponentValue() < .25) {
                    Float q = std::max<Float>(0, 1 - beta.MaxComponentValue());
                    if (r() < q)
                        break;
                    beta /= 1 - q;
                    PBRT_DBG("After RR with q = %f, beta: %f %f %f %f\n", q, beta[0],
                             beta[1], beta[2], beta[3]);
                }

                if (albedo) {
                    // Sample medium scattering for layered BSDF evaluation
                    Float sigma_t = 1;
                    Float dz = SampleExponential(r(), sigma_t / AbsCosTheta(w));
                    Float zp = w.z > 0 ? (z + dz) : (z - dz);
                    CHECK_RARE(1e-5, z == zp);
                    if (z == zp)
                        continue;
                    if (0 < zp && zp < thickness) {
                        // Handle scattering event in layered BSDF medium
#if 0
// TODO: cancel out and simplify: should be
// f *= AbsCosTheta(w) / sigma_t (!!!) -- that in turn makes the tricky cosine stuff
// more reasonable / palatible...
//beta *= Tr(dz, w) / ExponentialPDF(dz, sigma_t / AbsCosTheta(w));
beta *= AbsCosTheta(w) / sigma_t;
// Tricky cosines. Always divide here since we always
// include it when we leave a surface.
beta /= AbsCosTheta(w);
#endif
                        // Account for scattering through _exitInterface_ using _wis_
                        Float wt = 1;
                        if (!IsSpecular(exitInterface.Flags()))
                            wt = PowerHeuristic(1, wis.pdf, 1, phase.PDF(-w, -wis.wi));
                        Float te = Tr(zp - exitZ, wis.wi);
                        f += beta * albedo * phase.p(-w, -wis.wi) * wt * te * betaExit;

                        // Sample phase function and update layered path state
                        PhaseFunctionSample ps = phase.Sample_p(-w, Point2f(r(), r()));
                        if (!ps || ps.wi.z == 0)
                            continue;
                        beta *= albedo * ps.p / ps.pdf;
                        w = ps.wi;
                        z = zp;

                        if (!IsSpecular(exitInterface.Flags())) {
                            // Account for scattering through _exitInterface_ from new _w_
                            SampledSpectrum fExit = exitInterface.f(-w, wi, mode);
                            if (fExit) {
                                Float exitPDF = exitInterface.PDF(
                                    -w, wi, mode, BxDFReflTransFlags::Transmission);
                                Float weight = PowerHeuristic(1, ps.pdf, 1, exitPDF);
                                f += beta * Tr(zp - exitZ, ps.wi) * fExit * weight;
                            }
                        }

                        continue;
                    }
                    z = Clamp(zp, 0, thickness);

                } else {
                    // Advance to next layer boundary and update _beta_ for transmittance
                    z = (z == thickness) ? 0 : thickness;
                    beta *= Tr(thickness, w);
                }
                if (z == exitZ) {
                    // Account for reflection at _exitInterface_
                    Float uc = r();
                    Point2f u(r(), r());
                    BSDFSample bs = exitInterface.Sample_f(
                        -w, uc, u, mode, BxDFReflTransFlags::Reflection);
                    if (!bs || bs.pdf == 0 || bs.wi.z == 0)
                        break;
                    beta *= bs.f * AbsCosTheta(bs.wi) / bs.pdf;
                    w = bs.wi;

                } else {
                    // Account for scattering at _nonExitInterface_
                    if (!IsSpecular(nonExitInterface.Flags())) {
                        // Add NEE contribution along pre-sampled _wis_ direction
                        Float wt = 1;
                        if (!IsSpecular(exitInterface.Flags()))
                            wt = PowerHeuristic(1, wis.pdf, 1,
                                                nonExitInterface.PDF(-w, -wis.wi, mode));
                        f += beta * nonExitInterface.f(-w, -wis.wi, mode) *
                             AbsCosTheta(wis.wi) * wt * Tr(thickness, wis.wi) * betaExit;
                    }
                    // Sample new direction using BSDF at _nonExitInterface_
                    Float uc = r();
                    Point2f u(r(), r());
                    BSDFSample bs = nonExitInterface.Sample_f(
                        -w, uc, u, mode, BxDFReflTransFlags::Reflection);
                    if (!bs || bs.wi.z == 0)
                        break;
                    beta *= bs.f * AbsCosTheta(bs.wi) / bs.pdf;
                    w = bs.wi;

                    if (!IsSpecular(exitInterface.Flags())) {
                        // Add NEE contribution along direction from BSDF sample
                        SampledSpectrum fExit = exitInterface.f(-w, wi, mode);
                        if (fExit) {
                            Float wt = 1;
                            if (!IsSpecular(nonExitInterface.Flags())) {
                                Float exitPDF = exitInterface.PDF(
                                    -w, wi, mode, BxDFReflTransFlags::Transmission);
                                wt = PowerHeuristic(1, bs.pdf, 1, exitPDF);
                            }
                            f += beta * Tr(thickness, bs.wi) * fExit * wt;
                        }
                    }
                }
            }
        }
        return f / config.nSamples;
    }